

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ModuleData * __thiscall ExpressionContext::GetSourceOwner(ExpressionContext *this,Lexeme *lexeme)

{
  ModuleData *pMVar1;
  ModuleData **ppMVar2;
  uint i;
  uint index;
  
  index = 0;
  if ((lexeme->pos < this->code) || (this->codeEnd < lexeme->pos)) {
    while( true ) {
      if ((this->uniqueDependencies).count <= index) {
        __assert_fail("!\"failed to find source owner\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x808,"ModuleData *ExpressionContext::GetSourceOwner(Lexeme *)");
      }
      ppMVar2 = SmallArray<ModuleData_*,_128U>::operator[](&this->uniqueDependencies,index);
      pMVar1 = *ppMVar2;
      if ((pMVar1->lexStream <= lexeme) && (lexeme <= pMVar1->lexStream + pMVar1->lexStreamSize))
      break;
      index = index + 1;
    }
  }
  else {
    pMVar1 = (ModuleData *)0x0;
  }
  return pMVar1;
}

Assistant:

ModuleData* ExpressionContext::GetSourceOwner(Lexeme *lexeme)
{
	// Fast check for current module
	if(lexeme->pos >= code && lexeme->pos <= codeEnd)
		return NULL;

	for(unsigned i = 0; i < uniqueDependencies.size(); i++)
	{
		ModuleData *moduleData = uniqueDependencies[i];

		if(lexeme >= moduleData->lexStream && lexeme <= moduleData->lexStream + moduleData->lexStreamSize)
			return moduleData;
	}

	// Should not get here
	assert(!"failed to find source owner");
	return NULL;
}